

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O3

void __thiscall
TEST_TestHarness_c_checkLongLongIntText_Test::testBody
          (TEST_TestHarness_c_checkLongLongIntText_Test *this)

{
  TestTestingFixture *pTVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  uint uVar4;
  SimpleString local_30;
  
  CHECK_EQUAL_C_LONGLONG_LOCATION
            (2,2,"Text",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x118);
  TestTestingFixture::setTestFunction
            ((this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture,failLongLongIntTextMethod_)
  ;
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(&local_30,"expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
  TestTestingFixture::assertPrintContains(pTVar1,&local_30);
  SimpleString::~SimpleString(&local_30);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(&local_30,"arness_c");
  TestTestingFixture::assertPrintContains(pTVar1,&local_30);
  SimpleString::~SimpleString(&local_30);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(&local_30,"Message: LongLongTestText");
  TestTestingFixture::assertPrintContains(pTVar1,&local_30);
  SimpleString::~SimpleString(&local_30);
  pUVar2 = UtestShell::getCurrent();
  uVar4 = (uint)hasDestructorOfTheDestructorCheckedBeenCalled;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(uVar4 ^ 1),"CHECK","!hasDestructorOfTheDestructorCheckedBeenCalled",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x11e,pTVar3);
  return;
}

Assistant:

TEST(TestHarness_c, checkLongLongIntText)
{
    CHECK_EQUAL_C_LONGLONG_TEXT(2, 2, "Text");
    fixture->setTestFunction(failLongLongIntTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: LongLongTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}